

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option_button.cpp
# Opt level: O0

void option_button_draw_proc(Am_Object *self,Am_Drawonable *draw,int x_offset,int y_offset)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  Am_Value *pAVar7;
  ostream *poVar8;
  char *pcVar9;
  char *pcVar10;
  size_t sVar11;
  int iVar12;
  Am_Style *local_210;
  long local_148;
  long i;
  uint local_138;
  int len;
  int tri_y;
  int tri_x;
  int local_124;
  int local_120;
  int final_top;
  int final_left;
  int obj_top;
  int obj_left;
  int obj_height;
  int obj_width;
  int str_top;
  int str_left;
  int b;
  int a;
  int descent;
  int ascent;
  int str_width;
  Am_Style style;
  Am_Font local_d8;
  Am_Object local_d0;
  int local_c8;
  int local_c4;
  int y;
  int x;
  Am_Font local_b8;
  Am_Object local_b0;
  int local_a4;
  undefined1 local_a0 [4];
  int offset;
  Am_Value value;
  Am_Object obj;
  Am_String string;
  Am_Widget_Look look;
  Computed_Colors_Record color_rec;
  Am_Font local_60;
  Am_Font font;
  int local_50;
  bool fringe;
  bool key_selected;
  uint uStack_4c;
  bool active;
  int height;
  int width;
  int top;
  int left;
  int y_offset_local;
  int x_offset_local;
  Am_Drawonable *draw_local;
  Am_Object *self_local;
  
  pAVar7 = Am_Object::Get(self,100,0);
  iVar5 = Am_Value::operator_cast_to_int(pAVar7);
  width = iVar5 + x_offset;
  pAVar7 = Am_Object::Get(self,0x65,0);
  iVar5 = Am_Value::operator_cast_to_int(pAVar7);
  height = iVar5 + y_offset;
  pAVar7 = Am_Object::Get(self,0x66,0);
  uStack_4c = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(self,0x67,0);
  local_50 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(self,0xcc,0);
  font.data._7_1_ = Am_Value::operator_cast_to_bool(pAVar7);
  pAVar7 = Am_Object::Get(self,0x17c,0);
  font.data._6_1_ = Am_Value::operator_cast_to_bool(pAVar7);
  pAVar7 = Am_Object::Get(self,0x1c7,0);
  font.data._5_1_ = Am_Value::operator_cast_to_bool(pAVar7);
  Am_Font::Am_Font(&local_60,Am_FONT_FIXED,false,false,false,Am_FONT_MEDIUM);
  pAVar7 = Am_Object::Get(self,0xac,0);
  Am_Font::operator=(&local_60,pAVar7);
  pAVar7 = Am_Object::Get(self,0x1ad,0);
  Computed_Colors_Record::Computed_Colors_Record
            ((Computed_Colors_Record *)&stack0xffffffffffffff88,pAVar7);
  pAVar7 = Am_Object::Get(self,0x17f,0);
  Am_Widget_Look::Am_Widget_Look((Am_Widget_Look *)((long)&string.data + 4),pAVar7);
  Am_String::Am_String((Am_String *)&obj);
  Am_Object::Am_Object((Am_Object *)&value.value);
  Am_Value::Am_Value((Am_Value *)local_a0);
  pAVar7 = Am_Object::Peek(self,0x1ae,0);
  Am_Value::operator=((Am_Value *)local_a0,pAVar7);
  if (local_a0._0_2_ == 0x8008) {
    Am_String::operator=((Am_String *)&obj,(Am_Value *)local_a0);
  }
  else {
    if (local_a0._0_2_ != 0xa001) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar8 = std::operator<<(poVar8,"String slot of widget ");
      poVar8 = operator<<(poVar8,self);
      poVar8 = std::operator<<(poVar8," should have string or object type, but value is ");
      poVar8 = operator<<(poVar8,(Am_Value *)local_a0);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      Am_Error();
    }
    Am_Object::operator=((Am_Object *)&value.value,(Am_Value *)local_a0);
  }
  pAVar7 = Am_Object::Get(self,0x1cd,0);
  local_a4 = Am_Value::operator_cast_to_int(pAVar7);
  if (string.data._4_4_ == Am_MOTIF_LOOK_val) {
    pcVar9 = Am_String::operator_cast_to_char_((Am_String *)&obj);
    Am_Object::Am_Object(&local_b0,(Am_Object *)&value.value);
    bVar3 = font.data._7_1_;
    bVar2 = font.data._6_1_;
    bVar1 = font.data._5_1_;
    Am_Font::Am_Font(&local_b8,&local_60);
    x = string.data._4_4_;
    y = Am_LEFT_ALIGN.value;
    Am_Draw_Button_Widget
              (width,height,uStack_4c,local_50,pcVar9,&local_b0,false,false,(bool)(bVar3 & 1),
               (bool)(bVar2 & 1),false,(bool)(bVar1 & 1),&local_b8,
               (Computed_Colors_Record *)&stack0xffffffffffffff88,string.data._4_4_,Am_PUSH_BUTTON,
               draw,0,0,false,Am_LEFT_ALIGN,local_a4,false);
    Am_Font::~Am_Font(&local_b8);
    Am_Object::~Am_Object(&local_b0);
    local_c4 = (width - 0x18U) + uStack_4c;
    local_c8 = height + ((local_50 + -8) - (local_50 + -8 >> 0x1f) >> 1);
    (*draw->_vptr_Am_Drawonable[0x21])(draw,(ulong)(uint)width,(ulong)(uint)height,(ulong)uStack_4c)
    ;
    Am_Draw_Motif_Box(local_c4,local_c8,0xc,8,false,
                      (Computed_Colors_Record *)&stack0xffffffffffffff88,draw);
    (*draw->_vptr_Am_Drawonable[0x22])();
  }
  else if (string.data._4_4_ == Am_WINDOWS_LOOK_val) {
    pcVar9 = Am_String::operator_cast_to_char_((Am_String *)&obj);
    Am_Object::Am_Object(&local_d0,(Am_Object *)&value.value);
    bVar3 = font.data._7_1_;
    bVar2 = font.data._6_1_;
    bVar1 = font.data._5_1_;
    Am_Font::Am_Font(&local_d8,&local_60);
    Am_Draw_Button_Widget
              (width,height,uStack_4c,local_50,pcVar9,&local_d0,false,false,(bool)(bVar3 & 1),
               (bool)(bVar2 & 1),false,(bool)(bVar1 & 1),&local_d8,
               (Computed_Colors_Record *)&stack0xffffffffffffff88,string.data._4_4_,Am_PUSH_BUTTON,
               draw,0,0,false,Am_LEFT_ALIGN,local_a4,false);
    Am_Font::~Am_Font(&local_d8);
    Am_Object::~Am_Object(&local_d0);
    style.data._4_4_ = Am_WINDOWS_LOOK.value;
    draw_down_arrow((width - 0x10U) + uStack_4c,height,0x10,local_50,Am_WINDOWS_LOOK,false,true,true
                    ,(Computed_Colors_Record *)&stack0xffffffffffffff88,draw);
  }
  else {
    if (string.data._4_4_ != Am_MACINTOSH_LOOK_val) {
      Am_Error("Unknown Look parameter");
    }
    if ((font.data._5_1_ & 1) != 0) {
      width = width + 4;
      height = height + 4;
      uStack_4c = uStack_4c - 8;
      local_50 = local_50 + -8;
    }
    (*draw->_vptr_Am_Drawonable[0x2c])
              (draw,&Am_Black,&Am_No_Style,(ulong)(width + 3),(ulong)(height + 3),
               (ulong)(uStack_4c - 3));
    (*draw->_vptr_Am_Drawonable[0x2c])
              (draw,&Am_Black,&Am_White,(ulong)(uint)width,(ulong)(uint)height,
               (ulong)(uStack_4c - 1));
    iVar5 = width + 1;
    iVar6 = height + 1;
    if ((font.data._7_1_ & 1) == 0) {
      local_210 = &Am_Motif_Inactive_Stipple;
    }
    else {
      local_210 = &Am_Black;
    }
    Am_Style::Am_Style((Am_Style *)&ascent,local_210);
    pcVar9 = Am_String::operator_cast_to_char_((Am_String *)&obj);
    if (pcVar9 == (char *)0x0) {
      bVar4 = Am_Object::Valid((Am_Object *)&value.value);
      if (bVar4) {
        pAVar7 = Am_Object::Get((Am_Object *)&value.value,0x66,0);
        obj_left = Am_Value::operator_cast_to_int(pAVar7);
        pAVar7 = Am_Object::Get((Am_Object *)&value.value,0x67,0);
        obj_top = Am_Value::operator_cast_to_int(pAVar7);
        pAVar7 = Am_Object::Get((Am_Object *)&value.value,100,0);
        final_left = Am_Value::operator_cast_to_int(pAVar7);
        pAVar7 = Am_Object::Get((Am_Object *)&value.value,0x65,0);
        final_top = Am_Value::operator_cast_to_int(pAVar7);
        iVar12 = (uStack_4c - 3) - obj_left;
        local_120 = (iVar12 + -0x14) - (iVar12 + -0x14 >> 0x1f) >> 1;
        local_124 = ((local_50 + -3) - obj_top) / 2 + 2;
        Am_Object::Am_Object((Am_Object *)&tri_y,(Am_Object *)&value.value);
        Am_Draw((Am_Object *)&tri_y,draw,(iVar5 - final_left) + local_120,
                (iVar6 - final_top) + local_124);
        Am_Object::~Am_Object((Am_Object *)&tri_y);
      }
    }
    else {
      pcVar9 = Am_String::operator_cast_to_char_((Am_String *)&obj);
      pcVar10 = Am_String::operator_cast_to_char_((Am_String *)&obj);
      sVar11 = strlen(pcVar10);
      (*draw->_vptr_Am_Drawonable[0x1a])(draw,&local_60,pcVar9,sVar11 & 0xffffffff,&descent,&a);
      obj_width = local_a4 + iVar5;
      obj_height = iVar6 + (((local_50 + -3) - a) - b) / 2;
      pcVar9 = Am_String::operator_cast_to_char_((Am_String *)&obj);
      pcVar10 = Am_String::operator_cast_to_char_((Am_String *)&obj);
      sVar11 = strlen(pcVar10);
      (*draw->_vptr_Am_Drawonable[0x2e])
                (draw,&ascent,pcVar9,sVar11 & 0xffffffff,&local_60,(ulong)(uint)obj_width);
    }
    len = iVar5 + (uStack_4c - 3) + -0xf;
    local_138 = iVar6 + (local_50 + -9) / 2;
    i._4_4_ = 10;
    for (local_148 = 1; local_148 < 7; local_148 = local_148 + 1) {
      (*draw->_vptr_Am_Drawonable[0x28])
                (draw,&ascent,(ulong)(uint)len,(ulong)local_138,(ulong)(uint)(len + i._4_4_));
      len = len + 1;
      local_138 = local_138 + 1;
      i._4_4_ = i._4_4_ + -2;
    }
    Am_Style::~Am_Style((Am_Style *)&ascent);
  }
  Am_Value::~Am_Value((Am_Value *)local_a0);
  Am_Object::~Am_Object((Am_Object *)&value.value);
  Am_String::~Am_String((Am_String *)&obj);
  Computed_Colors_Record::~Computed_Colors_Record
            ((Computed_Colors_Record *)&stack0xffffffffffffff88);
  Am_Font::~Am_Font(&local_60);
  return;
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, option_button_draw,
                 (Am_Object self, Am_Drawonable *draw, int x_offset,
                  int y_offset))
{
  int left = (int)self.Get(Am_LEFT) + x_offset;
  int top = (int)self.Get(Am_TOP) + y_offset;
  int width = self.Get(Am_WIDTH);
  int height = self.Get(Am_HEIGHT);
  bool active = self.Get(Am_ACTIVE);
  bool key_selected = self.Get(Am_KEY_SELECTED);
  bool fringe = self.Get(Am_LEAVE_ROOM_FOR_FRINGE);
  Am_Font font;
  font = self.Get(Am_FONT);
  Computed_Colors_Record color_rec = self.Get(Am_STYLE_RECORD);
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);

  // now find the contents to draw in the button
  Am_String string;
  Am_Object obj;
  Am_Value value;

  // string slot contains a formula which gets the real object based on the
  // value of the COMMAND slot
  value = self.Peek(Am_REAL_STRING_OR_OBJ);
  if (value.type == Am_STRING)
    string = value;
  else if (value.type == Am_OBJECT)
    obj = value;
  else
    Am_ERRORO("String slot of widget "
                  << self << " should have string or object type, but value is "
                  << value,
              self, 0);

  int offset = self.Get(Am_MENU_ITEM_LEFT_OFFSET);

  // finally ready to draw it
  switch (look.value) {
  case Am_MOTIF_LOOK_val: {
    Am_Draw_Button_Widget(left, top, width, height, string, obj, false, false,
                          active, key_selected, false, fringe, font, color_rec,
                          look, Am_PUSH_BUTTON, draw, 0, 0, false,
                          Am_LEFT_ALIGN, offset);

    //now draw notch
    int x = left + width - NOTCH_OFFSET - NOTCH_WIDTH - 4;
    //center in Y
    int y = top + (height - NOTCH_HEIGHT) / 2;
    draw->Push_Clip(left, top, width, height);
    Am_Draw_Motif_Box(x, y, NOTCH_WIDTH, NOTCH_HEIGHT, false, color_rec, draw);
    draw->Pop_Clip();
    break;
  }

  case Am_WINDOWS_LOOK_val:
    Am_Draw_Button_Widget(left, top, width, height, string, obj, false, false,
                          active, key_selected, false, fringe, font, color_rec,
                          look, Am_PUSH_BUTTON, draw, 0, 0, false,
                          Am_LEFT_ALIGN, offset);
    draw_down_arrow(left + width - 16, top, 16, height, Am_WINDOWS_LOOK, false,
                    true, true, color_rec, draw);
    break;

  case Am_MACINTOSH_LOOK_val: {
    if (fringe) {
      left += 4;
      top += 4;
      width -= 8;
      height -= 8;
    }

    draw->Draw_Rectangle(Am_Black, Am_No_Style, left + 3, top + 3, width - 3,
                         height - 3);
    draw->Draw_Rectangle(Am_Black, Am_White, left, top, width - 1, height - 1);

    left += 1;
    top += 1;
    width -= 3;
    height -= 3;

    Am_Style style = active ? Am_Black : Am_Motif_Inactive_Stipple;

    if ((const char *)string) {
      int str_width, ascent, descent, a, b, str_left, str_top;

      draw->Get_String_Extents(font, string, strlen(string), str_width, ascent,
                               descent, a, b);

      str_left = offset + left;
      str_top = top + (height - ascent - descent) / 2;

      draw->Draw_Text(style, string, strlen(string), font, str_left, str_top);

    } else if (obj.Valid()) {
      int obj_width = obj.Get(Am_WIDTH), obj_height = obj.Get(Am_HEIGHT);
      int obj_left = obj.Get(Am_LEFT), obj_top = obj.Get(Am_TOP);
      int final_left = (width - 20 - obj_width) / 2,
          final_top = 2 + (height - obj_height) / 2;

      Am_Draw(obj, draw, left - obj_left + final_left,
              top - obj_top + final_top);
    }

    // draw little down arrow
    int tri_x = left + width - 15, tri_y = top + (height - 6) / 2,
        len =
            10; // len - is really 11, but one extra pixel is drawn to the right
    for (long i = 1; i <= 6; i++) {
      draw->Draw_Line(style, tri_x, tri_y, tri_x + len, tri_y);
      tri_x++;
      tri_y++;
      len -= 2;
    }
    break;
  }

  default:
    Am_Error("Unknown Look parameter");
    break;
  }
}